

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

void __thiscall
t_perl_generator::generate_serialize_container
          (t_perl_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  t_perl_generator *this_00;
  string kiter;
  string viter;
  allocator local_171;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "$xfer += $output->writeSetBegin(";
      poVar2 = std::operator<<(poVar2,"$xfer += $output->writeSetBegin(");
      type_to_enum_abi_cxx11_
                (&local_170,(t_perl_generator *)pcVar3,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar2 = std::operator<<(poVar2,(string *)&local_170);
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = std::operator<<(poVar2,"scalar(@{$");
      poVar2 = std::operator<<(poVar2,(string *)prefix);
      poVar2 = std::operator<<(poVar2,"}));");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      goto LAB_0026de8b;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "$xfer += $output->writeListBegin(";
      poVar2 = std::operator<<(poVar2,"$xfer += $output->writeListBegin(");
      type_to_enum_abi_cxx11_
                (&local_170,(t_perl_generator *)pcVar3,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar2 = std::operator<<(poVar2,(string *)&local_170);
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = std::operator<<(poVar2,"scalar(@{$");
      poVar2 = std::operator<<(poVar2,(string *)prefix);
      poVar2 = std::operator<<(poVar2,"}));");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      goto LAB_0026de8b;
    }
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    pcVar3 = "$xfer += $output->writeMapBegin(";
    poVar2 = std::operator<<(poVar2,"$xfer += $output->writeMapBegin(");
    type_to_enum_abi_cxx11_
              (&local_170,(t_perl_generator *)pcVar3,*(t_type **)&ttype[1].super_t_doc.has_doc_);
    poVar2 = std::operator<<(poVar2,(string *)&local_170);
    this_00 = (t_perl_generator *)0x2fdaef;
    poVar2 = std::operator<<(poVar2,", ");
    type_to_enum_abi_cxx11_(&local_150,this_00,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
    poVar2 = std::operator<<(poVar2,(string *)&local_150);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,"scalar(keys %{$");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,"}));");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_150);
LAB_0026de8b:
    std::__cxx11::string::~string((string *)&local_170);
  }
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      std::__cxx11::string::string((string *)&local_d0,"iter",(allocator *)&local_150);
      t_generator::tmp(&local_170,(t_generator *)this,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"foreach my $");
      poVar2 = std::operator<<(poVar2,(string *)&local_170);
      poVar2 = std::operator<<(poVar2," (@{$");
      poVar2 = std::operator<<(poVar2,(string *)prefix);
      poVar2 = std::operator<<(poVar2,"})");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      t_oop_generator::scope_up(&this->super_t_oop_generator,out);
      std::__cxx11::string::string((string *)&local_f0,(string *)&local_170);
      generate_serialize_set_element(this,out,(t_set *)ttype,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      goto LAB_0026e205;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      std::__cxx11::string::string((string *)&local_110,"iter",(allocator *)&local_150);
      t_generator::tmp(&local_170,(t_generator *)this,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"foreach my $");
      poVar2 = std::operator<<(poVar2,(string *)&local_170);
      poVar2 = std::operator<<(poVar2," (@{$");
      poVar2 = std::operator<<(poVar2,(string *)prefix);
      poVar2 = std::operator<<(poVar2,"}) ");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      t_oop_generator::scope_up(&this->super_t_oop_generator,out);
      std::__cxx11::string::string((string *)&local_130,(string *)&local_170);
      generate_serialize_list_element(this,out,(t_list *)ttype,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      goto LAB_0026e205;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"kiter",(allocator *)&local_150);
    t_generator::tmp(&local_170,(t_generator *)this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_70,"viter",&local_171);
    t_generator::tmp(&local_150,(t_generator *)this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"while( my ($");
    poVar2 = std::operator<<(poVar2,(string *)&local_170);
    poVar2 = std::operator<<(poVar2,",$");
    poVar2 = std::operator<<(poVar2,(string *)&local_150);
    poVar2 = std::operator<<(poVar2,") = each %{$");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,"}) ");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,out);
    std::__cxx11::string::string((string *)&local_90,(string *)&local_170);
    std::__cxx11::string::string((string *)&local_b0,(string *)&local_150);
    generate_serialize_map_element(this,out,(t_map *)ttype,&local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    std::__cxx11::string::~string((string *)&local_150);
LAB_0026e205:
    std::__cxx11::string::~string((string *)&local_170);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar1 == '\0') goto LAB_0026e282;
      pcVar3 = "$xfer += $output->writeListEnd();";
    }
    else {
      pcVar3 = "$xfer += $output->writeSetEnd();";
    }
  }
  else {
    pcVar3 = "$xfer += $output->writeMapEnd();";
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
LAB_0026e282:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  return;
}

Assistant:

void t_perl_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  if (ttype->is_map()) {
    indent(out) << "$xfer += $output->writeMapBegin("
                << type_to_enum(((t_map*)ttype)->get_key_type()) << ", "
                << type_to_enum(((t_map*)ttype)->get_val_type()) << ", "
                << "scalar(keys %{$" << prefix << "}));" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "$xfer += $output->writeSetBegin("
                << type_to_enum(((t_set*)ttype)->get_elem_type()) << ", "
                << "scalar(@{$" << prefix << "}));" << endl;

  } else if (ttype->is_list()) {

    indent(out) << "$xfer += $output->writeListBegin("
                << type_to_enum(((t_list*)ttype)->get_elem_type()) << ", "
                << "scalar(@{$" << prefix << "}));" << endl;
  }

  scope_up(out);

  if (ttype->is_map()) {
    string kiter = tmp("kiter");
    string viter = tmp("viter");
    indent(out) << "while( my ($" << kiter << ",$" << viter << ") = each %{$" << prefix << "}) "
                << endl;

    scope_up(out);
    generate_serialize_map_element(out, (t_map*)ttype, kiter, viter);
    scope_down(out);

  } else if (ttype->is_set()) {
    string iter = tmp("iter");
    indent(out) << "foreach my $" << iter << " (@{$" << prefix << "})" << endl;
    scope_up(out);
    generate_serialize_set_element(out, (t_set*)ttype, iter);
    scope_down(out);

  } else if (ttype->is_list()) {
    string iter = tmp("iter");
    indent(out) << "foreach my $" << iter << " (@{$" << prefix << "}) " << endl;
    scope_up(out);
    generate_serialize_list_element(out, (t_list*)ttype, iter);
    scope_down(out);
  }

  scope_down(out);

  if (ttype->is_map()) {
    indent(out) << "$xfer += $output->writeMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "$xfer += $output->writeSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "$xfer += $output->writeListEnd();" << endl;
  }

  scope_down(out);
}